

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrFacialExpressionsHTC *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrStructureType XVar3;
  pointer pcVar4;
  PFN_xrStructureTypeToString p_Var5;
  void *value_00;
  XrStructureType __val;
  uint uVar6;
  bool bVar7;
  char *pcVar8;
  XrInstance pXVar9;
  invalid_argument *this;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong __val_00;
  string next_prefix;
  string type_prefix;
  string sampletime_prefix;
  string isactive_prefix;
  string expressionweightings_prefix;
  string expressioncount_prefix;
  ostringstream oss_isActive;
  ostringstream oss_expressionCount;
  ostringstream oss_expressionWeightings;
  long *local_5a0;
  long local_598;
  long local_590 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  string local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  ios_base local_428 [264];
  undefined1 local_320 [24];
  uint auStack_308 [22];
  ios_base local_2b0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  paVar1 = &local_498.field_2;
  local_498._M_dataplus._M_p = (pointer)paVar1;
  local_320._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_498,'\x12');
  *local_498._M_dataplus._M_p = '0';
  local_498._M_dataplus._M_p[1] = 'x';
  pcVar8 = local_498._M_dataplus._M_p + (local_498._M_string_length - 1);
  lVar11 = 0;
  do {
    bVar2 = local_320[lVar11];
    *pcVar8 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar8[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar11 = lVar11 + 1;
    pcVar8 = pcVar8 + -2;
  } while (lVar11 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != paVar1) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_580,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_580);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = value->type;
    __val = -XVar3;
    if (0 < (int)XVar3) {
      __val = XVar3;
    }
    uVar14 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar13 = (ulong)__val;
      uVar6 = 4;
      do {
        uVar14 = uVar6;
        uVar10 = (uint)uVar13;
        if (uVar10 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_00190b38;
        }
        if (uVar10 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_00190b38;
        }
        if (uVar10 < 10000) goto LAB_00190b38;
        uVar13 = uVar13 / 10000;
        uVar6 = uVar14 + 4;
      } while (99999 < uVar10);
      uVar14 = uVar14 + 1;
    }
LAB_00190b38:
    local_520 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                 *)contents;
    local_498._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_498,(char)uVar14 - (char)((int)XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_498._M_dataplus._M_p + (XVar3 >> 0x1f),uVar14,__val);
    contents = (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_520;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              (local_520,(char (*) [16])"XrStructureType",&local_580,&local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_468 = 0;
    uStack_460 = 0;
    local_478 = 0;
    uStack_470 = 0;
    local_498.field_2._M_allocated_capacity = 0;
    local_498.field_2._8_8_ = 0;
    local_498._M_dataplus._M_p = (pointer)0x0;
    local_498._M_string_length = 0;
    p_Var5 = gen_dispatch_table->StructureTypeToString;
    pXVar9 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var5)(pXVar9,value->type,(char *)&local_498);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_580,(char (*) [64])&local_498);
  }
  local_5a0 = local_590;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5a0,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_5a0);
  value_00 = value->next;
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d8,local_5a0,local_598 + (long)local_5a0);
  bVar7 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_4d8,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Invalid Operation");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_540,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_540);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"0x",2);
  *(uint *)((long)&local_498.field_2 + *(long *)(local_498._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_498.field_2 + *(long *)(local_498._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_498);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"XrBool32",&local_540,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
  if ((XrFacialExpressionsHTC *)local_320._0_8_ != (XrFacialExpressionsHTC *)(local_320 + 0x10)) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_560,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_560);
  uVar13 = value->sampleTime;
  __val_00 = -uVar13;
  if (0 < (long)uVar13) {
    __val_00 = uVar13;
  }
  uVar14 = 1;
  if (9 < __val_00) {
    uVar12 = __val_00;
    uVar6 = 4;
    do {
      uVar14 = uVar6;
      if (uVar12 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_00190dbb;
      }
      if (uVar12 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_00190dbb;
      }
      if (uVar12 < 10000) goto LAB_00190dbb;
      bVar7 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      uVar6 = uVar14 + 4;
    } while (bVar7);
    uVar14 = uVar14 + 1;
  }
LAB_00190dbb:
  local_320._0_8_ = (XrFacialExpressionsHTC *)(local_320 + 0x10);
  std::__cxx11::string::_M_construct((ulong)local_320,(char)uVar14 - (char)((long)uVar13 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)(local_320._0_8_ + -((long)uVar13 >> 0x3f)),uVar14,__val_00);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [7])"XrTime",&local_560,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
  if ((XrFacialExpressionsHTC *)local_320._0_8_ != (XrFacialExpressionsHTC *)(local_320 + 0x10)) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4f8,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_4f8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"0x",2);
  *(uint *)((long)auStack_308 + *(XrTime *)(local_320._0_8_ + -0x18)) =
       *(uint *)((long)auStack_308 + *(XrTime *)(local_320._0_8_ + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)local_320);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_4f8,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_518,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_518);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(undefined8 *)
   ((long)&local_1a8[0]._M_string_length + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18)) = 0x20;
  std::ostream::_M_insert<void_const*>(local_1a8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [7])0x2a7c8c,&local_518,&local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
  std::ios_base::~ios_base(local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  if (local_5a0 != local_590) {
    operator_delete(local_5a0,local_590[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrFacialExpressionsHTC* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string isactive_prefix = prefix;
        isactive_prefix += "isActive";
        std::ostringstream oss_isActive;
        oss_isActive << "0x" << std::hex << (value->isActive);
        contents.emplace_back("XrBool32", isactive_prefix, oss_isActive.str());
        std::string sampletime_prefix = prefix;
        sampletime_prefix += "sampleTime";
        contents.emplace_back("XrTime", sampletime_prefix, std::to_string(value->sampleTime));
        std::string expressioncount_prefix = prefix;
        expressioncount_prefix += "expressionCount";
        std::ostringstream oss_expressionCount;
        oss_expressionCount << "0x" << std::hex << (value->expressionCount);
        contents.emplace_back("uint32_t", expressioncount_prefix, oss_expressionCount.str());
        std::string expressionweightings_prefix = prefix;
        expressionweightings_prefix += "expressionWeightings";
        std::ostringstream oss_expressionWeightings;
        oss_expressionWeightings << std::setprecision(32) << (value->expressionWeightings);
        contents.emplace_back("float*", expressionweightings_prefix, oss_expressionWeightings.str());
        return true;
    } catch(...) {
    }
    return false;
}